

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# demo_CH_filesystem.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  bool bVar1;
  bool bVar2;
  void *pvVar3;
  ostream *poVar4;
  char *__rhs;
  CSV_writer *pCVar5;
  size_t sVar6;
  path local_f70;
  resolver local_f48;
  path local_f30;
  path local_f08;
  resolver local_ee0;
  path local_ec8;
  path local_ea0;
  path local_e78;
  path local_e50;
  undefined1 local_e28 [72];
  undefined1 local_de0 [72];
  undefined1 local_d98 [72];
  path local_d50;
  path local_d28;
  path local_d00;
  path local_cd8;
  path local_cb0;
  undefined1 local_c88 [72];
  undefined1 local_c40 [72];
  undefined1 local_bf8 [72];
  path local_bb0;
  path local_b88;
  path local_b60;
  undefined1 local_b38 [72];
  undefined1 local_af0 [72];
  path local_aa8;
  path local_a80;
  path local_a58;
  path local_a30;
  path local_a08;
  path local_9e0;
  path local_9b8;
  path local_990;
  path local_968;
  path local_940;
  path local_918;
  path local_8f0;
  path local_8c8;
  path local_8a0;
  path local_878;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_850 [8];
  string nested;
  path local_830;
  path local_808;
  path local_7e0;
  path local_7b8;
  path local_790;
  path local_768;
  path local_740;
  allocator local_711;
  string local_710 [32];
  ChQuaternion<double> local_6f0;
  ChVector<double> local_6d0;
  allocator local_6b1;
  string local_6b0 [32];
  undefined1 local_690 [8];
  CSV_writer csv;
  path local_4d0;
  path local_4a8;
  path local_480;
  path local_458;
  path local_430;
  undefined4 local_404;
  path local_400;
  path local_3d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3b0 [8];
  string out_file;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_390 [8];
  string out_dir;
  path local_370;
  path local_348;
  path local_320;
  path local_2f8;
  path local_2d0;
  path local_2a8;
  path local_280;
  path local_258;
  path local_230;
  path local_208;
  path local_1e0;
  path local_1b8;
  path local_190;
  path local_168;
  path local_140;
  path local_118;
  path local_f0;
  path local_c8;
  path local_a0;
  undefined1 local_68 [8];
  path path2;
  path path1;
  char **argv_local;
  int argc_local;
  
  filesystem::path::path((path *)&path2.m_absolute,"/dir 1/dir 2/");
  filesystem::path::path((path *)local_68,"dir 3");
  bVar1 = filesystem::path::exists((path *)&path2.m_absolute);
  pvVar3 = (void *)std::ostream::operator<<(&std::cout,bVar1);
  std::ostream::operator<<(pvVar3,std::endl<char,std::char_traits<char>>);
  poVar4 = filesystem::operator<<((ostream *)&std::cout,(path *)&path2.m_absolute);
  std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  filesystem::path::operator/(&local_a0,(path *)&path2.m_absolute,(path *)local_68);
  poVar4 = filesystem::operator<<((ostream *)&std::cout,&local_a0);
  std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  filesystem::path::~path(&local_a0);
  filesystem::path::operator/(&local_f0,(path *)&path2.m_absolute,(path *)local_68);
  filesystem::path::parent_path(&local_c8,&local_f0);
  poVar4 = filesystem::operator<<((ostream *)&std::cout,&local_c8);
  std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  filesystem::path::~path(&local_c8);
  filesystem::path::~path(&local_f0);
  filesystem::path::operator/(&local_168,(path *)&path2.m_absolute,(path *)local_68);
  filesystem::path::parent_path(&local_140,&local_168);
  filesystem::path::parent_path(&local_118,&local_140);
  poVar4 = filesystem::operator<<((ostream *)&std::cout,&local_118);
  std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  filesystem::path::~path(&local_118);
  filesystem::path::~path(&local_140);
  filesystem::path::~path(&local_168);
  filesystem::path::operator/(&local_208,(path *)&path2.m_absolute,(path *)local_68);
  filesystem::path::parent_path(&local_1e0,&local_208);
  filesystem::path::parent_path(&local_1b8,&local_1e0);
  filesystem::path::parent_path(&local_190,&local_1b8);
  poVar4 = filesystem::operator<<((ostream *)&std::cout,&local_190);
  std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  filesystem::path::~path(&local_190);
  filesystem::path::~path(&local_1b8);
  filesystem::path::~path(&local_1e0);
  filesystem::path::~path(&local_208);
  filesystem::path::operator/(&local_2d0,(path *)&path2.m_absolute,(path *)local_68);
  filesystem::path::parent_path(&local_2a8,&local_2d0);
  filesystem::path::parent_path(&local_280,&local_2a8);
  filesystem::path::parent_path(&local_258,&local_280);
  filesystem::path::parent_path(&local_230,&local_258);
  poVar4 = filesystem::operator<<((ostream *)&std::cout,&local_230);
  std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  filesystem::path::~path(&local_230);
  filesystem::path::~path(&local_258);
  filesystem::path::~path(&local_280);
  filesystem::path::~path(&local_2a8);
  filesystem::path::~path(&local_2d0);
  filesystem::path::path(&local_320);
  filesystem::path::parent_path(&local_2f8,&local_320);
  poVar4 = filesystem::operator<<((ostream *)&std::cout,&local_2f8);
  std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  filesystem::path::~path(&local_2f8);
  filesystem::path::~path(&local_320);
  std::ostream::operator<<(&std::cout,std::endl<char,std::char_traits<char>>);
  poVar4 = std::operator<<((ostream *)&std::cout,"Current directory = ");
  filesystem::path::path(&local_370,".");
  filesystem::path::make_absolute(&local_348,&local_370);
  poVar4 = filesystem::operator<<(poVar4,&local_348);
  std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  filesystem::path::~path(&local_348);
  filesystem::path::~path(&local_370);
  std::ostream::operator<<(&std::cout,std::endl<char,std::char_traits<char>>);
  __rhs = (char *)chrono::GetChronoOutputPath_abi_cxx11_();
  std::operator+(local_390,__rhs);
  std::operator+(local_3b0,(char *)local_390);
  poVar4 = std::operator<<((ostream *)&std::cout,"Create output directory;  out_dir = ");
  poVar4 = std::operator<<(poVar4,(string *)local_390);
  std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  poVar4 = std::operator<<((ostream *)&std::cout,"  out_dir exists? ");
  filesystem::path::path(&local_3d8,local_390);
  bVar1 = filesystem::path::exists(&local_3d8);
  pvVar3 = (void *)std::ostream::operator<<(poVar4,bVar1);
  std::ostream::operator<<(pvVar3,std::endl<char,std::char_traits<char>>);
  filesystem::path::~path(&local_3d8);
  filesystem::path::path(&local_400,local_390);
  bVar1 = filesystem::create_directory(&local_400);
  filesystem::path::~path(&local_400);
  if (bVar1) {
    poVar4 = std::operator<<((ostream *)&std::cout,"  ...Created output directory");
    std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
    poVar4 = std::operator<<((ostream *)&std::cout,"  out_dir exists? ");
    filesystem::path::path(&local_430,local_390);
    bVar1 = filesystem::path::exists(&local_430);
    pvVar3 = (void *)std::ostream::operator<<(poVar4,bVar1);
    std::ostream::operator<<(pvVar3,std::endl<char,std::char_traits<char>>);
    filesystem::path::~path(&local_430);
    poVar4 = std::operator<<((ostream *)&std::cout,"  out_dir is directory? ");
    filesystem::path::path(&local_458,local_390);
    bVar1 = filesystem::path::is_directory(&local_458);
    pvVar3 = (void *)std::ostream::operator<<(poVar4,bVar1);
    std::ostream::operator<<(pvVar3,std::endl<char,std::char_traits<char>>);
    filesystem::path::~path(&local_458);
    poVar4 = std::operator<<((ostream *)&std::cout,"  path of out_dir: ");
    filesystem::path::path(&local_480,local_390);
    poVar4 = filesystem::operator<<(poVar4,&local_480);
    std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
    filesystem::path::~path(&local_480);
    poVar4 = std::operator<<((ostream *)&std::cout,"  abs. path of out_dir: ");
    filesystem::path::path(&local_4d0,local_390);
    filesystem::path::make_absolute(&local_4a8,&local_4d0);
    poVar4 = filesystem::operator<<(poVar4,&local_4a8);
    std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
    filesystem::path::~path(&local_4a8);
    filesystem::path::~path(&local_4d0);
    std::ostream::operator<<(&std::cout,std::endl<char,std::char_traits<char>>);
    poVar4 = std::operator<<((ostream *)&std::cout,"Create output file;  out_file = ");
    poVar4 = std::operator<<(poVar4,(string *)local_3b0);
    std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
    poVar4 = std::operator<<((ostream *)&std::cout,"  out_file exists? ");
    filesystem::path::path((path *)&csv.field_0x190,local_3b0);
    bVar1 = filesystem::path::exists((path *)&csv.field_0x190);
    pvVar3 = (void *)std::ostream::operator<<(poVar4,bVar1);
    std::ostream::operator<<(pvVar3,std::endl<char,std::char_traits<char>>);
    filesystem::path::~path((path *)&csv.field_0x190);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_6b0,",",&local_6b1);
    chrono::utils::CSV_writer::CSV_writer((CSV_writer *)local_690,(string *)local_6b0);
    std::__cxx11::string::~string(local_6b0);
    std::allocator<char>::~allocator((allocator<char> *)&local_6b1);
    chrono::ChVector<double>::ChVector(&local_6d0,1.0,2.0,3.0);
    pCVar5 = chrono::utils::operator<<((CSV_writer *)local_690,&local_6d0);
    chrono::ChQuaternion<double>::ChQuaternion(&local_6f0,1.0,0.0,0.0,0.0);
    pCVar5 = chrono::utils::operator<<(pCVar5,&local_6f0);
    chrono::utils::CSV_writer::operator<<(pCVar5,std::endl<char,std::char_traits<char>>);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_710,"",&local_711);
    chrono::utils::CSV_writer::write_to_file((CSV_writer *)local_690,local_3b0,(string *)local_710);
    std::__cxx11::string::~string(local_710);
    std::allocator<char>::~allocator((allocator<char> *)&local_711);
    poVar4 = std::operator<<((ostream *)&std::cout,"  ...Created output file");
    std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
    poVar4 = std::operator<<((ostream *)&std::cout,"  out_file exists? ");
    filesystem::path::path(&local_740,local_3b0);
    bVar1 = filesystem::path::exists(&local_740);
    pvVar3 = (void *)std::ostream::operator<<(poVar4,bVar1);
    std::ostream::operator<<(pvVar3,std::endl<char,std::char_traits<char>>);
    filesystem::path::~path(&local_740);
    poVar4 = std::operator<<((ostream *)&std::cout,"  out_file is file? ");
    filesystem::path::path(&local_768,local_3b0);
    bVar1 = filesystem::path::is_file(&local_768);
    pvVar3 = (void *)std::ostream::operator<<(poVar4,bVar1);
    std::ostream::operator<<(pvVar3,std::endl<char,std::char_traits<char>>);
    filesystem::path::~path(&local_768);
    poVar4 = std::operator<<((ostream *)&std::cout,"  path of out_file: ");
    filesystem::path::path(&local_790,local_3b0);
    poVar4 = filesystem::operator<<(poVar4,&local_790);
    std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
    filesystem::path::~path(&local_790);
    poVar4 = std::operator<<((ostream *)&std::cout,"  file location:    ");
    filesystem::path::path(&local_7e0,local_3b0);
    filesystem::path::parent_path(&local_7b8,&local_7e0);
    poVar4 = filesystem::operator<<(poVar4,&local_7b8);
    std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
    filesystem::path::~path(&local_7b8);
    filesystem::path::~path(&local_7e0);
    poVar4 = std::operator<<((ostream *)&std::cout,"  abs. path of out_file: ");
    filesystem::path::path(&local_830,local_3b0);
    filesystem::path::make_absolute(&local_808,&local_830);
    poVar4 = filesystem::operator<<(poVar4,&local_808);
    std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
    filesystem::path::~path(&local_808);
    filesystem::path::~path(&local_830);
    std::ostream::operator<<(&std::cout,std::endl<char,std::char_traits<char>>);
    std::operator+(local_850,(char *)local_390);
    poVar4 = std::operator<<((ostream *)&std::cout,"Create nested directories;  nested = ");
    poVar4 = std::operator<<(poVar4,(string *)local_850);
    std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
    poVar4 = std::operator<<((ostream *)&std::cout,"  nested (as path)   = ");
    filesystem::path::path(&local_878,local_850);
    poVar4 = filesystem::operator<<(poVar4,&local_878);
    std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
    filesystem::path::~path(&local_878);
    poVar4 = std::operator<<((ostream *)&std::cout,"  length of nested   = ");
    filesystem::path::path(&local_8a0,local_850);
    sVar6 = filesystem::path::length(&local_8a0);
    pvVar3 = (void *)std::ostream::operator<<(poVar4,sVar6);
    std::ostream::operator<<(pvVar3,std::endl<char,std::char_traits<char>>);
    filesystem::path::~path(&local_8a0);
    poVar4 = std::operator<<((ostream *)&std::cout,"  nested exists? ");
    filesystem::path::path(&local_8c8,local_850);
    bVar1 = filesystem::path::exists(&local_8c8);
    pvVar3 = (void *)std::ostream::operator<<(poVar4,bVar1);
    std::ostream::operator<<(pvVar3,std::endl<char,std::char_traits<char>>);
    filesystem::path::~path(&local_8c8);
    filesystem::path::path(&local_8f0,local_850);
    bVar1 = filesystem::create_subdirectory(&local_8f0);
    filesystem::path::~path(&local_8f0);
    if (bVar1) {
      poVar4 = std::operator<<((ostream *)&std::cout,"  ...Created nested subdirectories");
      std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
      poVar4 = std::operator<<((ostream *)&std::cout,"  nested exists? ");
      filesystem::path::path(&local_918,local_850);
      bVar2 = filesystem::path::exists(&local_918);
      pvVar3 = (void *)std::ostream::operator<<(poVar4,bVar2);
      std::ostream::operator<<(pvVar3,std::endl<char,std::char_traits<char>>);
      filesystem::path::~path(&local_918);
      poVar4 = std::operator<<((ostream *)&std::cout,"  nested is directory? ");
      filesystem::path::path(&local_940,local_850);
      bVar2 = filesystem::path::is_directory(&local_940);
      pvVar3 = (void *)std::ostream::operator<<(poVar4,bVar2);
      std::ostream::operator<<(pvVar3,std::endl<char,std::char_traits<char>>);
      filesystem::path::~path(&local_940);
      poVar4 = std::operator<<((ostream *)&std::cout,"  path of nested: ");
      filesystem::path::path(&local_968,local_850);
      poVar4 = filesystem::operator<<(poVar4,&local_968);
      std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
      filesystem::path::~path(&local_968);
      poVar4 = std::operator<<((ostream *)&std::cout,"  abs. path of nested: ");
      filesystem::path::path(&local_9b8,local_850);
      filesystem::path::make_absolute(&local_990,&local_9b8);
      poVar4 = filesystem::operator<<(poVar4,&local_990);
      std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
      filesystem::path::~path(&local_990);
      filesystem::path::~path(&local_9b8);
      std::ostream::operator<<(&std::cout,std::endl<char,std::char_traits<char>>);
      poVar4 = std::operator<<((ostream *)&std::cout,"some/path.ext:operator==() = ");
      filesystem::path::path(&local_9e0,"some/path.ext");
      filesystem::path::path(&local_a08,"some/path.ext");
      bVar2 = filesystem::path::operator==(&local_9e0,&local_a08);
      pvVar3 = (void *)std::ostream::operator<<(poVar4,bVar2);
      std::ostream::operator<<(pvVar3,std::endl<char,std::char_traits<char>>);
      filesystem::path::~path(&local_a08);
      filesystem::path::~path(&local_9e0);
      poVar4 = std::operator<<((ostream *)&std::cout,"some/path.ext:operator==() (unequal) = ");
      filesystem::path::path(&local_a30,"some/path.ext");
      filesystem::path::path(&local_a58,"another/path.ext");
      bVar2 = filesystem::path::operator==(&local_a30,&local_a58);
      pvVar3 = (void *)std::ostream::operator<<(poVar4,bVar2);
      std::ostream::operator<<(pvVar3,std::endl<char,std::char_traits<char>>);
      filesystem::path::~path(&local_a58);
      filesystem::path::~path(&local_a30);
      poVar4 = std::operator<<((ostream *)&std::cout,"nonexistant:exists = ");
      filesystem::path::path(&local_a80,"nonexistant");
      bVar2 = filesystem::path::exists(&local_a80);
      pvVar3 = (void *)std::ostream::operator<<(poVar4,bVar2);
      std::ostream::operator<<(pvVar3,std::endl<char,std::char_traits<char>>);
      filesystem::path::~path(&local_a80);
      poVar4 = std::operator<<((ostream *)&std::cout,"nonexistant:is_file = ");
      filesystem::path::path(&local_aa8,"nonexistant");
      bVar2 = filesystem::path::is_file(&local_aa8);
      pvVar3 = (void *)std::ostream::operator<<(poVar4,bVar2);
      std::ostream::operator<<(pvVar3,std::endl<char,std::char_traits<char>>);
      filesystem::path::~path(&local_aa8);
      poVar4 = std::operator<<((ostream *)&std::cout,"nonexistant:is_directory = ");
      filesystem::path::path((path *)(local_af0 + 0x20),"nonexistant");
      bVar2 = filesystem::path::is_directory((path *)(local_af0 + 0x20));
      pvVar3 = (void *)std::ostream::operator<<(poVar4,bVar2);
      std::ostream::operator<<(pvVar3,std::endl<char,std::char_traits<char>>);
      filesystem::path::~path((path *)(local_af0 + 0x20));
      poVar4 = std::operator<<((ostream *)&std::cout,"nonexistant:filename = ");
      filesystem::path::path((path *)(local_b38 + 0x20),"nonexistant");
      filesystem::path::filename_abi_cxx11_((path *)local_af0);
      poVar4 = std::operator<<(poVar4,(string *)local_af0);
      std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
      std::__cxx11::string::~string((string *)local_af0);
      filesystem::path::~path((path *)(local_b38 + 0x20));
      poVar4 = std::operator<<((ostream *)&std::cout,"nonexistant:extension = ");
      filesystem::path::path(&local_b60,"nonexistant");
      filesystem::path::extension_abi_cxx11_((path *)local_b38);
      poVar4 = std::operator<<(poVar4,(string *)local_b38);
      std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
      std::__cxx11::string::~string((string *)local_b38);
      filesystem::path::~path(&local_b60);
      std::ostream::operator<<(&std::cout,std::endl<char,std::char_traits<char>>);
      poVar4 = std::operator<<((ostream *)&std::cout,"out_file:exists = ");
      filesystem::path::path(&local_b88,local_3b0);
      bVar2 = filesystem::path::exists(&local_b88);
      pvVar3 = (void *)std::ostream::operator<<(poVar4,bVar2);
      std::ostream::operator<<(pvVar3,std::endl<char,std::char_traits<char>>);
      filesystem::path::~path(&local_b88);
      poVar4 = std::operator<<((ostream *)&std::cout,"out_file:is_file = ");
      filesystem::path::path(&local_bb0,local_3b0);
      bVar2 = filesystem::path::is_file(&local_bb0);
      pvVar3 = (void *)std::ostream::operator<<(poVar4,bVar2);
      std::ostream::operator<<(pvVar3,std::endl<char,std::char_traits<char>>);
      filesystem::path::~path(&local_bb0);
      poVar4 = std::operator<<((ostream *)&std::cout,"out_file:is_directory = ");
      filesystem::path::path((path *)(local_bf8 + 0x20),local_3b0);
      bVar2 = filesystem::path::is_directory((path *)(local_bf8 + 0x20));
      pvVar3 = (void *)std::ostream::operator<<(poVar4,bVar2);
      std::ostream::operator<<(pvVar3,std::endl<char,std::char_traits<char>>);
      filesystem::path::~path((path *)(local_bf8 + 0x20));
      poVar4 = std::operator<<((ostream *)&std::cout,"out_file:filename = ");
      filesystem::path::path((path *)(local_c40 + 0x20),local_3b0);
      filesystem::path::filename_abi_cxx11_((path *)local_bf8);
      poVar4 = std::operator<<(poVar4,(string *)local_bf8);
      std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
      std::__cxx11::string::~string((string *)local_bf8);
      filesystem::path::~path((path *)(local_c40 + 0x20));
      poVar4 = std::operator<<((ostream *)&std::cout,"out_file:stem = ");
      filesystem::path::path((path *)(local_c88 + 0x20),local_3b0);
      filesystem::path::stem_abi_cxx11_((path *)local_c40);
      poVar4 = std::operator<<(poVar4,(string *)local_c40);
      std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
      std::__cxx11::string::~string((string *)local_c40);
      filesystem::path::~path((path *)(local_c88 + 0x20));
      poVar4 = std::operator<<((ostream *)&std::cout,"out_file:extension = ");
      filesystem::path::path(&local_cb0,local_3b0);
      filesystem::path::extension_abi_cxx11_((path *)local_c88);
      poVar4 = std::operator<<(poVar4,(string *)local_c88);
      std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
      std::__cxx11::string::~string((string *)local_c88);
      filesystem::path::~path(&local_cb0);
      poVar4 = std::operator<<((ostream *)&std::cout,"out_file:make_absolute = ");
      filesystem::path::path(&local_d00,local_3b0);
      filesystem::path::make_absolute(&local_cd8,&local_d00);
      poVar4 = filesystem::operator<<(poVar4,&local_cd8);
      std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
      filesystem::path::~path(&local_cd8);
      filesystem::path::~path(&local_d00);
      std::ostream::operator<<(&std::cout,std::endl<char,std::char_traits<char>>);
      poVar4 = std::operator<<((ostream *)&std::cout,"out_dir:exists = ");
      filesystem::path::path(&local_d28,local_390);
      bVar2 = filesystem::path::exists(&local_d28);
      pvVar3 = (void *)std::ostream::operator<<(poVar4,bVar2);
      std::ostream::operator<<(pvVar3,std::endl<char,std::char_traits<char>>);
      filesystem::path::~path(&local_d28);
      poVar4 = std::operator<<((ostream *)&std::cout,"out_dir:is_file = ");
      filesystem::path::path(&local_d50,local_390);
      bVar2 = filesystem::path::is_file(&local_d50);
      pvVar3 = (void *)std::ostream::operator<<(poVar4,bVar2);
      std::ostream::operator<<(pvVar3,std::endl<char,std::char_traits<char>>);
      filesystem::path::~path(&local_d50);
      poVar4 = std::operator<<((ostream *)&std::cout,"out_dir:is_directory = ");
      filesystem::path::path((path *)(local_d98 + 0x20),local_390);
      bVar2 = filesystem::path::is_directory((path *)(local_d98 + 0x20));
      pvVar3 = (void *)std::ostream::operator<<(poVar4,bVar2);
      std::ostream::operator<<(pvVar3,std::endl<char,std::char_traits<char>>);
      filesystem::path::~path((path *)(local_d98 + 0x20));
      poVar4 = std::operator<<((ostream *)&std::cout,"out_dir:filename = ");
      filesystem::path::path((path *)(local_de0 + 0x20),local_390);
      filesystem::path::filename_abi_cxx11_((path *)local_d98);
      poVar4 = std::operator<<(poVar4,(string *)local_d98);
      std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
      std::__cxx11::string::~string((string *)local_d98);
      filesystem::path::~path((path *)(local_de0 + 0x20));
      poVar4 = std::operator<<((ostream *)&std::cout,"out_dir:stem = ");
      filesystem::path::path((path *)(local_e28 + 0x20),local_390);
      filesystem::path::stem_abi_cxx11_((path *)local_de0);
      poVar4 = std::operator<<(poVar4,(string *)local_de0);
      std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
      std::__cxx11::string::~string((string *)local_de0);
      filesystem::path::~path((path *)(local_e28 + 0x20));
      poVar4 = std::operator<<((ostream *)&std::cout,"out_dir:extension = ");
      filesystem::path::path(&local_e50,local_390);
      filesystem::path::extension_abi_cxx11_((path *)local_e28);
      poVar4 = std::operator<<(poVar4,(string *)local_e28);
      std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
      std::__cxx11::string::~string((string *)local_e28);
      filesystem::path::~path(&local_e50);
      poVar4 = std::operator<<((ostream *)&std::cout,"out_dir:make_absolute = ");
      filesystem::path::path(&local_ea0,local_390);
      filesystem::path::make_absolute(&local_e78,&local_ea0);
      poVar4 = filesystem::operator<<(poVar4,&local_e78);
      std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
      filesystem::path::~path(&local_e78);
      filesystem::path::~path(&local_ea0);
      std::ostream::operator<<(&std::cout,std::endl<char,std::char_traits<char>>);
      poVar4 = std::operator<<((ostream *)&std::cout,"resolve(out_file) = ");
      filesystem::resolver::resolver(&local_ee0);
      filesystem::path::path(&local_f08,local_3b0);
      filesystem::resolver::resolve(&local_ec8,&local_ee0,&local_f08);
      poVar4 = filesystem::operator<<(poVar4,&local_ec8);
      std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
      filesystem::path::~path(&local_ec8);
      filesystem::path::~path(&local_f08);
      filesystem::resolver::~resolver(&local_ee0);
      poVar4 = std::operator<<((ostream *)&std::cout,"resolve(nonexistant) = ");
      filesystem::resolver::resolver(&local_f48);
      filesystem::path::path(&local_f70,"nonexistant");
      filesystem::resolver::resolve(&local_f30,&local_f48,&local_f70);
      poVar4 = filesystem::operator<<(poVar4,&local_f30);
      std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
      filesystem::path::~path(&local_f30);
      filesystem::path::~path(&local_f70);
      filesystem::resolver::~resolver(&local_f48);
    }
    else {
      poVar4 = std::operator<<((ostream *)&std::cout,"  ...Error creating subdirectories");
      std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
    }
    argv_local._4_4_ = (uint)!bVar1;
    local_404 = 1;
    std::__cxx11::string::~string((string *)local_850);
    chrono::utils::CSV_writer::~CSV_writer((CSV_writer *)local_690);
  }
  else {
    poVar4 = std::operator<<((ostream *)&std::cout,"  ...Error creating output directory");
    std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
    argv_local._4_4_ = 1;
    local_404 = 1;
  }
  std::__cxx11::string::~string((string *)local_3b0);
  std::__cxx11::string::~string((string *)local_390);
  filesystem::path::~path((path *)local_68);
  filesystem::path::~path((path *)&path2.m_absolute);
  return argv_local._4_4_;
}

Assistant:

int main(int argc, char** argv) {
#if defined(WIN32)
    path path1("C:\\dir 1\\dir 2\\");
#else
    path path1("/dir 1/dir 2/");
#endif

    path path2("dir 3");

    cout << path1.exists() << endl;
    cout << path1 << endl;
    cout << (path1 / path2) << endl;
    cout << (path1 / path2).parent_path() << endl;
    cout << (path1 / path2).parent_path().parent_path() << endl;
    cout << (path1 / path2).parent_path().parent_path().parent_path() << endl;
    cout << (path1 / path2).parent_path().parent_path().parent_path().parent_path() << endl;
    cout << path().parent_path() << endl;
    cout << endl;

    // Absolute path of current directory
    cout << "Current directory = " << path(".").make_absolute() << endl;
    cout << endl;

    // Create output directory and output file
    std::string out_dir = GetChronoOutputPath() + "DEMO_FILESYSTEM";
    std::string out_file = out_dir + "/foo.txt";

    cout << "Create output directory;  out_dir = " << out_dir << endl;
    cout << "  out_dir exists? " << path(out_dir).exists() << endl;
    if (create_directory(path(out_dir))) {
        cout << "  ...Created output directory" << endl;
    } else {
        cout << "  ...Error creating output directory" << endl;
        return 1;
    }
    cout << "  out_dir exists? " << path(out_dir).exists() << endl;
    cout << "  out_dir is directory? " << path(out_dir).is_directory() << endl;
    cout << "  path of out_dir: " << path(out_dir) << endl;
    cout << "  abs. path of out_dir: " << path(out_dir).make_absolute() << endl;
    cout << endl;

    cout << "Create output file;  out_file = " << out_file << endl;
    cout << "  out_file exists? " << path(out_file).exists() << endl;
    utils::CSV_writer csv(",");
    csv << ChVector<>(1, 2, 3) << ChQuaternion<>(1, 0, 0, 0) << endl;
    csv.write_to_file(out_file);
    cout << "  ...Created output file" << endl;
    cout << "  out_file exists? " << path(out_file).exists() << endl;
    cout << "  out_file is file? " << path(out_file).is_file() << endl;
    cout << "  path of out_file: " << path(out_file) << endl;
    cout << "  file location:    " << path(out_file).parent_path() << endl;
    cout << "  abs. path of out_file: " << path(out_file).make_absolute() << endl;
    cout << endl;

    // Create hierarchy of nested directories
#if defined(WIN32)
    std::string nested = out_dir + "\\child\\grandchild";
#else
    std::string nested = out_dir + "/child/grandchild";
#endif
    cout << "Create nested directories;  nested = " << nested << endl;
    cout << "  nested (as path)   = " << path(nested) << endl;
    cout << "  length of nested   = " << path(nested).length() << endl;
    cout << "  nested exists? " << path(nested).exists() << endl;
    if (create_subdirectory(path(nested))) {
        cout << "  ...Created nested subdirectories" << endl;
    } else {
        cout << "  ...Error creating subdirectories" << endl;
        return 1;
    }
    cout << "  nested exists? " << path(nested).exists() << endl;
    cout << "  nested is directory? " << path(nested).is_directory() << endl;
    cout << "  path of nested: " << path(nested) << endl;
    cout << "  abs. path of nested: " << path(nested).make_absolute() << endl;
    cout << endl;

    // Other tests

    cout << "some/path.ext:operator==() = " << (path("some/path.ext") == path("some/path.ext")) << endl;
    cout << "some/path.ext:operator==() (unequal) = " << (path("some/path.ext") == path("another/path.ext")) << endl;

    cout << "nonexistant:exists = " << path("nonexistant").exists() << endl;
    cout << "nonexistant:is_file = " << path("nonexistant").is_file() << endl;
    cout << "nonexistant:is_directory = " << path("nonexistant").is_directory() << endl;
    cout << "nonexistant:filename = " << path("nonexistant").filename() << endl;
    cout << "nonexistant:extension = " << path("nonexistant").extension() << endl;
    cout << endl;

    cout << "out_file:exists = " << path(out_file).exists() << endl;
    cout << "out_file:is_file = " << path(out_file).is_file() << endl;
    cout << "out_file:is_directory = " << path(out_file).is_directory() << endl;
    cout << "out_file:filename = " << path(out_file).filename() << endl;
    cout << "out_file:stem = " << path(out_file).stem() << endl;
    cout << "out_file:extension = " << path(out_file).extension() << endl;
    cout << "out_file:make_absolute = " << path(out_file).make_absolute() << endl;
    cout << endl;

    cout << "out_dir:exists = " << path(out_dir).exists() << endl;
    cout << "out_dir:is_file = " << path(out_dir).is_file() << endl;
    cout << "out_dir:is_directory = " << path(out_dir).is_directory() << endl;
    cout << "out_dir:filename = " << path(out_dir).filename() << endl;
    cout << "out_dir:stem = " << path(out_dir).stem() << endl;
    cout << "out_dir:extension = " << path(out_dir).extension() << endl;
    cout << "out_dir:make_absolute = " << path(out_dir).make_absolute() << endl;
    cout << endl;

    cout << "resolve(out_file) = " << resolver().resolve(out_file) << endl;
    cout << "resolve(nonexistant) = " << resolver().resolve("nonexistant") << endl;
    return 0;
}